

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O2

uint64 ctemplate::MurmurHash64(char *ptr,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)len ^ 0xc86b14f7;
  uVar2 = 0x650f5c4d;
  for (; 7 < len; len = len - 8) {
    uVar1 = uVar1 * 0x5bd1e995 ^
            ((uint)(*(int *)ptr * 0x5bd1e995) >> 0x18 ^ *(int *)ptr * 0x5bd1e995) * 0x5bd1e995;
    uVar2 = uVar2 * 0x5bd1e995 ^
            ((uint)(*(int *)((long)ptr + 4) * 0x5bd1e995) >> 0x18 ^
            *(int *)((long)ptr + 4) * 0x5bd1e995) * 0x5bd1e995;
    ptr = (char *)((long)ptr + 8);
  }
  if (3 < len) {
    uVar1 = uVar1 * 0x18 ^
            ((uint)(*(int *)ptr * 0x5bd1e995) >> 0x18 ^ *(int *)ptr * 0x5bd1e995) * 0x5bd1e995;
    ptr = (char *)((long)ptr + 4);
    len = len - 4;
  }
  if (len != 1) {
    if (len != 2) {
      if (len != 3) goto LAB_001319ea;
      uVar2 = uVar2 ^ (int)*(char *)((long)ptr + 2) << 0x10;
    }
    uVar2 = uVar2 ^ (int)*(char *)((long)ptr + 1) << 8;
  }
  uVar2 = uVar2 ^ (int)(char)*(int *)ptr;
LAB_001319ea:
  uVar3 = (uVar2 * 0x5bd1e995 >> 0x12 ^ uVar1) * 0x5bd1e995;
  uVar1 = (uVar3 >> 0x16 ^ uVar2 * 0x5bd1e995) * 0x5bd1e995;
  return CONCAT44((uVar1 >> 0x11 ^ uVar3) * 0x5bd1e995,uVar1);
}

Assistant:

uint64 MurmurHash64(const char* ptr, size_t len) {
  const uint32 kMultiplyVal = 0x5bd1e995;
  const int kShiftVal = 24;
  const uint32 kHashSeed1 = 0xc86b14f7;
  const uint32 kHashSeed2 = 0x650f5c4d;

  uint32 h1 = kHashSeed1 ^ len, h2 = kHashSeed2;
  while (len >= 8) {
    uint32 k1 = UNALIGNED_LOAD32(ptr);
    k1 *= kMultiplyVal;
    k1 ^= k1 >> kShiftVal;
    k1 *= kMultiplyVal;

    h1 *= kMultiplyVal;
    h1 ^= k1;
    ptr += 4;

    uint32 k2 = UNALIGNED_LOAD32(ptr);
    k2 *= kMultiplyVal;
    k2 ^= k2 >> kShiftVal;
    k2 *= kMultiplyVal;

    h2 *= kMultiplyVal;
    h2 ^= k2;
    ptr += 4;

    len -= 8;
  }

  if (len >= 4) {
    uint32 k1 = UNALIGNED_LOAD32(ptr);
    k1 *= kMultiplyVal;
    k1 ^= k1 >> kShiftVal;
    k1 *= kMultiplyVal;

    h1 *= kShiftVal;
    h1 ^= k1;

    ptr += 4;
    len -= 4;
  }

  switch(len) {
    case 3:
      h2 ^= ptr[2] << 16;  // fall through.
    case 2:
      h2 ^= ptr[1] << 8;  // fall through.
    case 1:
      h2 ^= ptr[0];  // fall through.
    default:
      h2 *= kMultiplyVal;
  }

  h1 ^= h2 >> 18;
  h1 *= kMultiplyVal;
  h2 ^= h1 >> 22;
  h2 *= kMultiplyVal;
  h1 ^= h2 >> 17;
  h1 *= kMultiplyVal;

  uint64 h = h1;
  h = (h << 32) | h2;
  return h;
}